

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBDataCollection.cpp
# Opt level: O0

void __thiscall amrex::EBDataCollection::~EBDataCollection(EBDataCollection *this)

{
  void *pvVar1;
  value_type pMVar2;
  reference ppMVar3;
  long in_RDI;
  int idim;
  value_type in_stack_ffffffffffffff98;
  value_type in_stack_ffffffffffffffa0;
  undefined4 local_c;
  
  if (*(long **)(in_RDI + 0xe8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0xe8) + 8))();
  }
  if (*(long **)(in_RDI + 0xf0) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0xf0) + 8))();
  }
  if (*(long **)(in_RDI + 0xf8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0xf8) + 8))();
  }
  pvVar1 = *(void **)(in_RDI + 0x100);
  if (pvVar1 != (void *)0x0) {
    MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419b25);
    operator_delete(pvVar1,0x188);
  }
  pvVar1 = *(void **)(in_RDI + 0x108);
  if (pvVar1 != (void *)0x0) {
    MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419b55);
    operator_delete(pvVar1,0x188);
  }
  pvVar1 = *(void **)(in_RDI + 0x118);
  if (pvVar1 != (void *)0x0) {
    MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419b85);
    operator_delete(pvVar1,0x188);
  }
  pvVar1 = *(void **)(in_RDI + 0x110);
  if (pvVar1 != (void *)0x0) {
    MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419bb5);
    operator_delete(pvVar1,0x188);
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    ppMVar3 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                        ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    pMVar2 = *ppMVar3;
    if (pMVar2 != (value_type)0x0) {
      MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419c05);
      operator_delete(pMVar2,0x188);
    }
    ppMVar3 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                        ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa0 = *ppMVar3;
    if (in_stack_ffffffffffffffa0 != (value_type)0x0) {
      MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419c42);
      operator_delete(in_stack_ffffffffffffffa0,0x188);
    }
    ppMVar3 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                        ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = *ppMVar3;
    if (in_stack_ffffffffffffff98 != (value_type)0x0) {
      MultiCutFab::~MultiCutFab((MultiCutFab *)0x1419c7d);
      operator_delete(in_stack_ffffffffffffff98,0x188);
    }
  }
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1419ca7);
  return;
}

Assistant:

EBDataCollection::~EBDataCollection ()
{
    delete m_cellflags;
    delete m_levelset;
    delete m_volfrac;
    delete m_centroid;
    delete m_bndrycent;
    delete m_bndrynorm;
    delete m_bndryarea;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        delete m_areafrac[idim];
        delete m_facecent[idim];
        delete m_edgecent[idim];
    }
}